

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GetShapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_getshape(NeuralNetworkLayer *this)

{
  ulong uVar1;
  GetShapeLayerParams *pGVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x429) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x429;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pGVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::GetShapeLayerParams>
                       (arena);
    (this->layer_).getshape_ = pGVar2;
  }
  return (GetShapeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GetShapeLayerParams* NeuralNetworkLayer::_internal_mutable_getshape() {
  if (!_internal_has_getshape()) {
    clear_layer();
    set_has_getshape();
    layer_.getshape_ = CreateMaybeMessage< ::CoreML::Specification::GetShapeLayerParams >(GetArenaForAllocation());
  }
  return layer_.getshape_;
}